

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O3

void __thiscall
Omega_h::Overlay::Overlay
          (Overlay *this,int *argc,char ***argv,Vector<3> *overlayGridCenter,double cellSize,
          size_t Nx,size_t Ny,size_t Nz)

{
  _Rb_tree_header *p_Var1;
  Mesh *__return_storage_ptr__;
  double *pdVar2;
  int *piVar3;
  iterator iVar4;
  _Alloc_hider _Var5;
  Alloc *pAVar6;
  LO LVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int i_4;
  int i;
  pointer pcVar11;
  undefined1 auVar12 [16];
  Write<double> new_coords;
  Reals coords;
  Vector<3> diff;
  Vector<3> c_1;
  Vector<3> x;
  string local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1c8;
  Write<double> local_1b8;
  Write<double> local_1a8;
  double local_198 [3];
  Vector<3> *local_180;
  Alloc *local_178;
  element_type *local_170;
  CommPtr local_168;
  double local_158;
  double dStack_150;
  pointer local_148;
  pointer psStack_140;
  Alloc *local_138;
  pointer psStack_130;
  pointer local_128;
  pointer local_120 [6];
  Adj local_f0;
  Adj local_c0;
  Adj local_90;
  Adj local_60;
  
  this->cell_size = cellSize;
  p_Var1 = &(this->library).timers._M_t._M_impl.super__Rb_tree_header;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->library).argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->library).argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->library).argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->library).world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->library).world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->library).self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->library).self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->library).timers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)cellSize;
  Library::initialize(&this->library,"9.34.13-sha.dc235450+00000010000000001",argc,argv);
  Library::world(&this->library);
  __return_storage_ptr__ = &this->mesh;
  local_148 = (pointer)((double)local_1c8 *
                       (((double)(Nx >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                       (double)(Nx & 0xffffffff | 0x4330000000000000)));
  psStack_140 = (pointer)((double)local_1c8 *
                         (((double)(Ny >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                         (double)(Ny & 0xffffffff | 0x4330000000000000)));
  auVar12._8_4_ = (int)(Nz >> 0x20);
  auVar12._0_8_ = Nz;
  auVar12._12_4_ = 0x45300000;
  dStack_150 = auVar12._8_8_ - 1.9342813113834067e+25;
  local_158 = (dStack_150 + ((double)CONCAT44(0x43300000,(LO)Nz) - 4503599627370496.0)) *
              (double)local_1c8;
  build_box(__return_storage_ptr__,&local_168,OMEGA_H_HYPERCUBE,(Real)local_148,(Real)psStack_140,
            local_158,(LO)Nx,(LO)Ny,(LO)Nz,false);
  local_180 = overlayGridCenter;
  if (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1c8 = &this->silly_cells;
  local_1d0 = &this->silly_edges;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LVar7 = Omega_h::Mesh::nregions(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_1c8,(long)LVar7);
  LVar7 = Omega_h::Mesh::nfaces(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_faces,(long)LVar7);
  LVar7 = Omega_h::Mesh::nedges(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_1d0,(long)LVar7);
  LVar7 = Omega_h::Mesh::nverts(__return_storage_ptr__);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_nodes,(long)LVar7);
  pcVar11 = (pointer)0x0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nregions(__return_storage_ptr__);
    if ((long)LVar7 <= (long)pcVar11) break;
    iVar4._M_current =
         (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1f8._M_dataplus._M_p = pcVar11;
    if (iVar4._M_current ==
        (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (local_1c8,iVar4,(unsigned_long *)&local_1f8);
    }
    else {
      *iVar4._M_current = (unsigned_long)pcVar11;
      (this->silly_cells).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pcVar11 = pcVar11 + 1;
  }
  pcVar11 = (pointer)0x0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nfaces(__return_storage_ptr__);
    if ((long)LVar7 <= (long)pcVar11) break;
    iVar4._M_current =
         (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1f8._M_dataplus._M_p = pcVar11;
    if (iVar4._M_current ==
        (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->silly_faces,iVar4,(unsigned_long *)&local_1f8);
    }
    else {
      *iVar4._M_current = (unsigned_long)pcVar11;
      (this->silly_faces).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pcVar11 = pcVar11 + 1;
  }
  pcVar11 = (pointer)0x0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nedges(__return_storage_ptr__);
    if ((long)LVar7 <= (long)pcVar11) break;
    iVar4._M_current =
         (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1f8._M_dataplus._M_p = pcVar11;
    if (iVar4._M_current ==
        (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (local_1d0,iVar4,(unsigned_long *)&local_1f8);
    }
    else {
      *iVar4._M_current = (unsigned_long)pcVar11;
      (this->silly_edges).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pcVar11 = pcVar11 + 1;
  }
  pcVar11 = (pointer)0x0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nverts(__return_storage_ptr__);
    if ((long)LVar7 <= (long)pcVar11) break;
    iVar4._M_current =
         (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1f8._M_dataplus._M_p = pcVar11;
    if (iVar4._M_current ==
        (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->silly_nodes,iVar4,(unsigned_long *)&local_1f8);
    }
    else {
      *iVar4._M_current = (unsigned_long)pcVar11;
      (this->silly_nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pcVar11 = pcVar11 + 1;
  }
  Omega_h::Mesh::coords((Mesh *)&local_178);
  LVar7 = Omega_h::Mesh::nverts(__return_storage_ptr__);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  Write<double>::Write(&local_1b8,LVar7 * 3,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_198[2] = (local_180->super_Few<double,_3>).array_[2];
  local_198[0] = (local_180->super_Few<double,_3>).array_[0];
  local_198[1] = (local_180->super_Few<double,_3>).array_[1];
  local_1f8._M_dataplus._M_p = (pointer)((double)local_148 * 0.5);
  local_1f8._M_string_length = (size_type)((double)psStack_140 * 0.5);
  local_1f8.field_2._M_allocated_capacity = (size_type)(local_158 * 0.5);
  lVar8 = 0;
  do {
    (&local_138)[lVar8] = (Alloc *)(local_198[lVar8] - (double)(&local_1f8._M_dataplus)[lVar8]._M_p)
    ;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  while( true ) {
    LVar7 = Omega_h::Mesh::nverts(__return_storage_ptr__);
    if (LVar7 <= lVar8) break;
    uVar9 = lVar8 * 0x18 & 0x7fffffff8;
    local_1f8.field_2._M_allocated_capacity = (size_type)local_128;
    local_1f8._M_dataplus._M_p = (pointer)local_138;
    local_1f8._M_string_length = (size_type)psStack_130;
    local_198[2] = *(double *)((long)&(local_170->srcs_).write_.shared_alloc_.direct_ptr + uVar9);
    pdVar2 = (double *)((long)&local_170->library_ + uVar9);
    local_198[0] = *pdVar2;
    local_198[1] = pdVar2[1];
    lVar10 = 0;
    do {
      local_120[lVar10] =
           (pointer)(local_198[lVar10] + (double)(&local_1f8._M_dataplus)[lVar10]._M_p);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    *(pointer *)((long)local_1b8.shared_alloc_.direct_ptr + uVar9 + 0x10) = local_120[2];
    *(undefined8 *)((long)local_1b8.shared_alloc_.direct_ptr + uVar9) = local_120[0];
    ((undefined8 *)((long)local_1b8.shared_alloc_.direct_ptr + uVar9))[1] = local_120[1];
    lVar8 = lVar8 + 1;
  }
  local_1a8.shared_alloc_.alloc = local_1b8.shared_alloc_.alloc;
  if (((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.shared_alloc_.alloc = (Alloc *)((local_1b8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1b8.shared_alloc_.alloc)->use_count = (local_1b8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1a8.shared_alloc_.direct_ptr = local_1b8.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)&local_1f8,&local_1a8);
  Omega_h::Mesh::set_coords(__return_storage_ptr__,(Reals *)&local_1f8);
  _Var5._M_p = local_1f8._M_dataplus._M_p;
  if (((ulong)local_1f8._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_1f8._M_dataplus._M_p != (Alloc *)0x0) {
    piVar3 = (int *)(local_1f8._M_dataplus._M_p + 0x30);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_1f8._M_dataplus._M_p);
      operator_delete(_Var5._M_p,0x48);
    }
  }
  pAVar6 = local_1a8.shared_alloc_.alloc;
  if (((ulong)local_1a8.shared_alloc_.alloc & 7) == 0 &&
      local_1a8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_1a8.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_1a8.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  Omega_h::Mesh::ask_down(&local_60,__return_storage_ptr__,2,0);
  Adj::~Adj(&local_60);
  Omega_h::Mesh::ask_down(&local_90,__return_storage_ptr__,3,0);
  Adj::~Adj(&local_90);
  Omega_h::Mesh::ask_down(&local_c0,__return_storage_ptr__,3,2);
  Adj::~Adj(&local_c0);
  Omega_h::Mesh::ask_up(&local_f0,__return_storage_ptr__,2,3);
  Adj::~Adj(&local_f0);
  if (((ulong)local_1b8.shared_alloc_.alloc & 7) == 0 &&
      local_1b8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_1b8.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_1b8.shared_alloc_.alloc);
      operator_delete(local_1b8.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    piVar3 = &local_178->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_178);
      operator_delete(local_178,0x48);
    }
  }
  return;
}

Assistant:

Overlay::Overlay(
    int* argc, char*** argv, const Omega_h::Vector<3>& overlayGridCenter,
    double cellSize, size_t Nx, size_t Ny, size_t Nz
#ifdef OMEGA_H_USE_MPI
    ,
    MPI_Comm comm
#endif
    )
    : cell_size(cellSize),
      library(argc, argv
#ifdef OMEGA_H_USE_MPI
          ,
          comm
#endif
          ),
      mesh(build_box(library.world(), OMEGA_H_HYPERCUBE, Nx * cellSize,
          Ny * cellSize, Nz * cellSize, LO(Nx), LO(Ny), LO(Nz))) {
  silly_cells.reserve(size_t(mesh.nregions()));
  silly_faces.reserve(size_t(mesh.nfaces()));
  silly_edges.reserve(size_t(mesh.nedges()));
  silly_nodes.reserve(size_t(mesh.nverts()));
  for (int i = 0; i < mesh.nregions(); ++i) silly_cells.push_back(size_t(i));
  for (int i = 0; i < mesh.nfaces(); ++i) silly_faces.push_back(size_t(i));
  for (int i = 0; i < mesh.nedges(); ++i) silly_edges.push_back(size_t(i));
  for (int i = 0; i < mesh.nverts(); ++i) silly_nodes.push_back(size_t(i));
  auto coords = mesh.coords();
  auto new_coords = Write<double>(mesh.nverts() * 3);
  auto diff = overlayGridCenter - vector_3(Nx * cellSize / 2.0,
                                      Ny * cellSize / 2.0, Nz * cellSize / 2.0);
  for (int i = 0; i < mesh.nverts(); ++i) {
    auto x = get_vector<3>(coords, i);
    x += diff;
    set_vector(new_coords, i, x);
  }
  mesh.set_coords(new_coords);
  mesh.ask_down(FACE, VERT);
  mesh.ask_down(REGION, VERT);
  mesh.ask_down(REGION, FACE);
  mesh.ask_up(FACE, REGION);
}